

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

void Abc_NtkTransformBack
               (Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,Vec_Ptr_t *vControls,Vec_Int_t *vClasses)

{
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  long *plVar3;
  Abc_Obj_t *pObj;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = pNtkOld->vPos->nSize;
  if (iVar6 != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                  ,0x25b,
                  "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
  }
  for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + 1) {
    pAVar1 = Abc_NtkPo(pNtkOld,iVar5);
    pAVar2 = Abc_NtkPo(pNtkNew,iVar5);
    (pAVar1->field_6).pCopy = pAVar2;
    iVar6 = pNtkOld->vPos->nSize;
  }
  iVar6 = 0;
  while( true ) {
    if (vControls->nSize <= iVar6) {
      if (pNtkNew->nObjCounts[8] == vClasses->nSize) {
        for (iVar6 = 0; iVar6 < pNtkNew->vBoxes->nSize; iVar6 = iVar6 + 1) {
          pAVar1 = Abc_NtkBox(pNtkNew,iVar6);
          if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
            iVar5 = Vec_IntEntry(vClasses,iVar6);
            if (iVar5 != -1) {
              plVar3 = (long *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
              pAVar2 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
              plVar3 = (long *)Vec_PtrEntry(vControls,iVar5);
              pFanin = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
              pObj = Abc_NtkCreateNode(pNtkNew);
              Abc_ObjAddFanin(pObj,pFanin);
              Abc_ObjAddFanin(pObj,pAVar2);
              Abc_ObjAddFanin(pObj,(Abc_Obj_t *)
                                   pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray]);
              pcVar4 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,"0-1 1\n11- 1\n");
              (pObj->field_5).pData = pcVar4;
              Abc_ObjPatchFanin((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray],
                                pAVar2,pObj);
            }
          }
        }
        for (iVar6 = 0; iVar6 < vControls->nSize; iVar6 = iVar6 + 1) {
          pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vControls,iVar6);
          Abc_NtkDeleteObj(pAVar1);
        }
        return;
      }
      __assert_fail("Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                    ,0x266,
                    "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)")
      ;
    }
    plVar3 = (long *)Vec_PtrEntry(vControls,iVar6);
    if (((*(uint *)((long)plVar3 + 0x14) & 0xf) != 3) || ((Abc_Ntk_t *)*plVar3 != pNtkOld)) break;
    Vec_PtrWriteEntry(vControls,iVar6,(void *)plVar3[8]);
    iVar6 = iVar6 + 1;
  }
  __assert_fail("Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                ,0x262,
                "void Abc_NtkTransformBack(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

void Abc_NtkTransformBack( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, Vec_Ptr_t * vControls, Vec_Int_t * vClasses )
{
    Abc_Obj_t * pObj, * pNodeNew, * pCtrl, * pDriver;
    int i, Class;
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    // match the POs of the old into new
    Abc_NtkForEachPo( pNtkOld, pObj, i )
        pObj->pCopy = Abc_NtkPo( pNtkNew, i );
    // remap the flops
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        assert( Abc_ObjIsPo(pObj) && pObj->pNtk == pNtkOld );
        Vec_PtrWriteEntry( vControls, i, pObj->pCopy );
    }
    // create self-loops
    assert( Abc_NtkLatchNum(pNtkNew) == Vec_IntSize(vClasses) );
    Abc_NtkForEachLatch( pNtkNew, pObj, i )
    {
        Class = Vec_IntEntry( vClasses, i );
        if ( Class == -1 )
            continue;
        pDriver = Abc_ObjFanin0(Abc_ObjFanin0(pObj));
        pCtrl = (Abc_Obj_t *)Vec_PtrEntry( vControls, Class );
        pCtrl = Abc_ObjFanin0( pCtrl );
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pNodeNew, pCtrl );
        Abc_ObjAddFanin( pNodeNew, pDriver );
        Abc_ObjAddFanin( pNodeNew, Abc_ObjFanout0(pObj) );
        Abc_ObjSetData( pNodeNew, Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc, "0-1 1\n11- 1\n") );
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, pNodeNew );
    }
    // remove the useless POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
        Abc_NtkDeleteObj( pObj );
}